

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

bool __thiscall ON_UuidPairList2::FindId1(ON_UuidPairList2 *this,ON_UUID *id1,ON_UUID *id2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  iterator iVar3;
  
  iVar3 = std::
          _Hashtable<ON_UUID_struct,_std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_ON_UUID_struct>_>,_std::__detail::_Select1st,_std::equal_to<ON_UUID_struct>,_ON_UuidList2_Private<ON_UUID_struct>::UuidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<ON_UUID_struct,_std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_ON_UUID_struct>_>,_std::__detail::_Select1st,_std::equal_to<ON_UUID_struct>,_ON_UuidList2_Private<ON_UUID_struct>::UuidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this->m_private)._M_t.
                    super___uniq_ptr_impl<ON_UuidPairList2_Private,_std::default_delete<ON_UuidPairList2_Private>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ON_UuidPairList2_Private_*,_std::default_delete<ON_UuidPairList2_Private>_>
                    .super__Head_base<0UL,_ON_UuidPairList2_Private_*,_false>._M_head_impl,id1);
  if (id2 != (ON_UUID *)0x0 &&
      iVar3.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>._M_cur
      != (__node_type *)0x0) {
    uVar1 = *(undefined8 *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>
                    ._M_cur + 0x18);
    uVar2 = *(undefined8 *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>
                    ._M_cur + 0x20);
    id2->Data1 = (int)uVar1;
    id2->Data2 = (short)((ulong)uVar1 >> 0x20);
    id2->Data3 = (short)((ulong)uVar1 >> 0x30);
    *(undefined8 *)id2->Data4 = uVar2;
  }
  return iVar3.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>.
         _M_cur != (__node_type *)0x0;
}

Assistant:

bool ON_UuidPairList2::FindId1(const ON_UUID& id1, ON_UUID* id2) const
{
  const auto it = m_private->map.find(id1);

  if (it != m_private->map.end())
  {
    if (id2)
    {
      *id2 = it->second;
    }
    return true;
  }
  return false;
}